

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

void __thiscall arangodb::velocypack::ArrayIterator::ArrayIterator(ArrayIterator *this,Slice slice)

{
  ValueLength VVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  size_t __n;
  long extraout_RDX;
  char *this_00;
  uint8_t *puStack_40;
  uint8_t *local_10;
  
  (this->_slice)._start = slice._start;
  this->_current = (uint8_t *)0x0;
  this->_size = 0;
  this->_position = 0;
  local_10 = slice._start;
  if (SliceStaticData::TypeMap[*slice._start] == Array) {
    VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::arrayLength
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_10);
    this->_size = VVar1;
    puVar2 = first(this);
    this->_current = puVar2;
    return;
  }
  velocypack::ArrayIterator();
  if (extraout_RDX == 0 || slice._start != (uint8_t *)0x0) {
    puVar2 = extraout_RDX - slice._start;
    puStack_40 = puVar2;
    if ((uint8_t *)0xf < puVar2) {
      puVar3 = (uint8_t *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (size_type *)&puStack_40,0);
      (this->_slice)._start = puVar3;
      this->_size = (ValueLength)puStack_40;
    }
    if (puVar2 != (uint8_t *)0x0) {
      puVar3 = (this->_slice)._start;
      if (puVar2 == (uint8_t *)0x1) {
        *puVar3 = *slice._start;
      }
      else {
        memcpy(puVar3,slice._start,(size_t)puVar2);
      }
    }
    this->_current = puStack_40;
    puStack_40[(long)(this->_slice)._start] = '\0';
    return;
  }
  this_00 = "basic_string::_M_construct null not valid";
  std::__throw_logic_error("basic_string::_M_construct null not valid");
  __n = strlen((char *)slice._start);
  if (__n <= (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)->
              _M_string_length ^ 0x7fffffffffffffff)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)slice._start,__n);
    return;
  }
  std::__throw_length_error("basic_string::append");
}

Assistant:

explicit ArrayIterator(Slice slice)
      : _slice{slice}, _current{nullptr}, _size{0}, _position{0} {
    auto const head = slice.head();
    if (VELOCYPACK_UNLIKELY(slice.type(head) != ValueType::Array)) {
      throw Exception{Exception::InvalidValueType, "Expecting Array slice"};
    }
    _size = slice.arrayLength();
    _current = first();
  }